

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon_merge_example.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  initializer_list<glm::vec<2,_float,_(glm::qualifier)0>_> __l;
  initializer_list<glm::vec<2,_float,_(glm::qualifier)0>_> __l_00;
  allocator_type local_b9;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  edge_list2;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  edge_list;
  PolygonMerge merge;
  
  merge.heap_.objs_.
  super__Vector_base<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x42c8000042c80000;
  merge.out_lines_.super__Vector_base<TRM::VertexList,_std::allocator<TRM::VertexList>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x42c8000041200000;
  merge.heap_.objs_.
  super__Vector_base<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4120000041200000;
  merge.heap_.objs_.
  super__Vector_base<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4120000042c80000;
  merge.out_lines_.super__Vector_base<TRM::VertexList,_std::allocator<TRM::VertexList>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4120000041200000;
  __l._M_len = 5;
  __l._M_array = (iterator)&merge;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector(&edge_list,__l,(allocator_type *)&edge_list2);
  merge.heap_.objs_.
  super__Vector_base<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x42a0000042a00000;
  merge.out_lines_.super__Vector_base<TRM::VertexList,_std::allocator<TRM::VertexList>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x42a0000041a00000;
  merge.heap_.objs_.
  super__Vector_base<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x42a0000041a00000;
  merge.heap_.objs_.
  super__Vector_base<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>,_std::allocator<std::unique_ptr<TRM::Object,_std::default_delete<TRM::Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x41a0000041a00000;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&merge;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector(&edge_list2,__l_00,&local_b9);
  TRM::PolygonMerge::PolygonMerge(&merge);
  TRM::PolygonMerge::do_merge(&merge,&edge_list,&edge_list2);
  TRM::PolygonMerge::~PolygonMerge(&merge);
  std::
  _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&edge_list2.
                   super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 );
  std::
  _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&edge_list.
                   super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 );
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
  std::vector<glm::vec2> edge_list{
      {10, 10},
      {100, 10},
      {100, 100},
      {10, 100},
      {10, 10},
  };

  std::vector<glm::vec2> edge_list2{
      {20, 80},
      {20, 20},
      {80, 80},
      {20, 80},
  };


  TRM::PolygonMerge merge{};

  merge.do_merge(edge_list, edge_list2);


  return 0;
}